

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlChar *pxVar1;
  xmlXPathObjectPtr value;
  xmlChar *stringval;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      pxVar1 = xmlXPathCastNodeToString(ctxt->context->node);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      value = xmlXPathCacheWrapString(ctxt,pxVar1);
      valuePush(ctxt,value);
    }
    else if (ctxt != (xmlXPathParserContextPtr)0x0) {
      if (nargs == 1) {
        if (ctxt->valueNr < 1) {
          xmlXPathErr(ctxt,0x17);
        }
        else {
          stringval = (xmlChar *)valuePop(ctxt);
          if ((xmlXPathObjectPtr)stringval == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,10);
          }
          else {
            if (((xmlXPathObjectPtr)stringval)->type != XPATH_STRING) {
              pxVar1 = xmlXPathCastToString((xmlXPathObjectPtr)stringval);
              if (pxVar1 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              xmlXPathReleaseObject(ctxt->context,(xmlXPathObjectPtr)stringval);
              stringval = (xmlChar *)xmlXPathCacheWrapString(ctxt,pxVar1);
            }
            valuePush(ctxt,(xmlXPathObjectPtr)stringval);
          }
        }
      }
      else {
        xmlXPathErr(ctxt,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    xmlChar *stringval;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        stringval = xmlXPathCastNodeToString(ctxt->context->node);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        valuePush(ctxt, xmlXPathCacheWrapString(ctxt, stringval));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_STRING) {
        stringval = xmlXPathCastToString(cur);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheWrapString(ctxt, stringval);
    }
    valuePush(ctxt, cur);
}